

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O1

ssize_t anon_unknown.dwarf_3353::ReadPersistent(int fd,void *buf,size_t count)

{
  char cVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  ssize_t extraout_RAX;
  undefined4 extraout_var;
  ulong uVar6;
  undefined4 in_register_0000003c;
  ssize_t sVar5;
  
  piVar4 = (int *)CONCAT44(in_register_0000003c,fd);
  if (fd < 0) {
    _GLOBAL__N_1::ReadPersistent();
    sVar5 = extraout_RAX;
    if (-1 < *piVar4) {
      iVar2 = close(*piVar4);
      sVar5 = CONCAT44(extraout_var,iVar2);
    }
    return sVar5;
  }
  uVar6 = 0;
  do {
    if (count < uVar6 || count - uVar6 == 0) goto LAB_0010bd5b;
    do {
      sVar3 = read(fd,(void *)((long)buf + uVar6),count - uVar6);
      if (-1 < sVar3) {
        uVar6 = uVar6 + sVar3;
        cVar1 = (sVar3 == 0) * '\x05';
        goto LAB_0010bd52;
      }
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    cVar1 = '\x01';
LAB_0010bd52:
  } while (cVar1 == '\0');
  if (cVar1 == '\x05') {
LAB_0010bd5b:
    if (count < uVar6) {
      syscall(1,2,"Check failed: num_bytes <= count\n",0x21);
      abort();
    }
  }
  else {
    uVar6 = 0xffffffffffffffff;
  }
  return uVar6;
}

Assistant:

static ssize_t ReadPersistent(const int fd, void *buf, const size_t count) {
  CHECK_GE(fd, 0);
  char *buf0 = reinterpret_cast<char *>(buf);
  ssize_t num_bytes = 0;
  while (num_bytes < count) {
    ssize_t len;
    NO_INTR(len = read(fd, buf0 + num_bytes, count - num_bytes));
    if (len < 0) {  // There was an error other than EINTR.
      return -1;
    }
    if (len == 0) {  // Reached EOF.
      break;
    }
    num_bytes += len;
  }
  CHECK(num_bytes <= count);
  return num_bytes;
}